

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator
          (ImmutableMessageLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  ClassNameResolver *pCVar3;
  Descriptor *pDVar4;
  reference ppVar5;
  Nonnull<const_char_*> failure_msg;
  long v2;
  OneofDescriptor *pOVar6;
  long v1;
  long lVar7;
  string_view str;
  node_handle<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_void>
  node;
  undefined1 local_68 [16];
  OneofDescriptor *local_58;
  map_slot_type<int,_const_google::protobuf::OneofDescriptor_*> *local_50;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
  local_48;
  
  MessageGenerator::MessageGenerator(&this->super_MessageGenerator,descriptor);
  (this->super_MessageGenerator)._vptr_MessageGenerator =
       (_func_int **)&PTR__ImmutableMessageLiteGenerator_019114e0;
  this->context_ = context;
  pCVar3 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar3;
  MakeImmutableFieldLiteGenerators(&this->field_generators_,descriptor,context);
  if ((context->options_).enforce_lite != true) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
               ,0x3b,"!HasDescriptorMethods(descriptor->file(), context->EnforceLite())");
    str._M_str = 
    "Generator factory error: A lite message generator is used to generate non-lite messages.";
    str._M_len = 0x58;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_68,str);
LAB_00e70c04:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_68)
    ;
  }
  pDVar4 = (this->super_MessageGenerator).descriptor_;
  if (0 < pDVar4->field_count_) {
    lVar7 = 0;
    v1 = 0;
    do {
      bVar2 = IsRealOneof((FieldDescriptor *)(&pDVar4->fields_->super_SymbolBase + lVar7));
      if (bVar2) {
        pDVar4 = (this->super_MessageGenerator).descriptor_;
        v2 = (long)pDVar4->field_count_;
        if (v2 <= v1) {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (v1,v2,"index < field_count()");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xa88,failure_msg);
          goto LAB_00e70c04;
        }
        pFVar1 = pDVar4->fields_;
        if (((&pFVar1->field_0x1)[lVar7] & 0x10) == 0) {
          pOVar6 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar6 = *(OneofDescriptor **)((long)&pFVar1->scope_ + lVar7);
          if (pOVar6 == (OneofDescriptor *)0x0) {
            protobuf::internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        local_68[1] = 1;
        local_68._12_4_ = 0;
        local_68._8_4_ =
             (int)((ulong)((long)pOVar6 - (long)pOVar6->containing_type_->oneof_decls_) >> 3) *
             -0x49249249;
        local_50 = (map_slot_type<int,_const_google::protobuf::OneofDescriptor_*> *)(local_68 + 8);
        local_58 = pOVar6;
        absl::lts_20250127::container_internal::
        btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
        ::
        insert_unique<int,absl::lts_20250127::container_internal::map_slot_type<int,google::protobuf::OneofDescriptor_const*>*&>
                  (&local_48,
                   (btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
                    *)&(this->super_MessageGenerator).oneofs_,&local_50->key,&local_50);
        ppVar5 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*(&local_48.first);
        if (ppVar5->second != pOVar6) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_68,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/lite/message.cc"
                     ,0x41,"oneofs_.emplace(oneof->index(), oneof).first->second == oneof");
          goto LAB_00e70c04;
        }
      }
      v1 = v1 + 1;
      pDVar4 = (this->super_MessageGenerator).descriptor_;
      lVar7 = lVar7 + 0x58;
    } while (v1 < pDVar4->field_count_);
  }
  return;
}

Assistant:

ImmutableMessageLiteGenerator::ImmutableMessageLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : MessageGenerator(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(MakeImmutableFieldLiteGenerators(descriptor, context)) {
  ABSL_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      const OneofDescriptor* oneof = descriptor_->field(i)->containing_oneof();
      ABSL_CHECK(oneofs_.emplace(oneof->index(), oneof).first->second == oneof);
    }
  }
}